

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdioLogSystem.cpp
# Opt level: O0

void __thiscall StdioLogSystem::LogInternal(StdioLogSystem *this,char *format,__va_list_tag *args)

{
  __va_list_tag *args_local;
  char *format_local;
  StdioLogSystem *this_local;
  
  vsnprintf(this->m_buff,0xfff,format,args);
  this->m_buff[0xfff] = '\0';
  std::operator<<((ostream *)&std::cout,this->m_buff);
  return;
}

Assistant:

void StdioLogSystem::LogInternal(const char * format, va_list args)
{
	vsnprintf(m_buff, LOGSYSTEM_MAX_BUFFER-1, format, args);
	// Make sure there's a limit to the amount of rubbish we can output
	m_buff[LOGSYSTEM_MAX_BUFFER-1] = '\0';

	std::cout << m_buff;
#ifdef _WIN32
	OutputDebugStringA( m_buff );
#endif
}